

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O3

void labpack_writer_buffer_data(labpack_writer_t *writer,char *buffer)

{
  char *pcVar1;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0xae,"void labpack_writer_buffer_data(labpack_writer_t *, char *)");
  }
  if (writer->status != LABPACK_STATUS_OK) {
    return;
  }
  if (buffer == (char *)0x0) {
    writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
    pcVar1 = "The buffer cannot be NULL";
  }
  else {
    if (writer->buffer != (char *)0x0) {
      memcpy(buffer,writer->buffer,writer->size);
      return;
    }
    writer->status = LABPACK_STATUS_ERROR_ENCODER;
    pcVar1 = "The encoder is not done";
  }
  writer->status_message = pcVar1;
  return;
}

Assistant:

void
labpack_writer_buffer_data(labpack_writer_t* writer, char* buffer)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        if (!buffer) {
            writer->status = LABPACK_STATUS_ERROR_NULL_VALUE;
            writer->status_message = "The buffer cannot be NULL";
            return;
        }
        if (!writer->buffer) {
            writer->status = LABPACK_STATUS_ERROR_ENCODER;
            writer->status_message = "The encoder is not done";
            return;
        }
        memcpy(buffer, writer->buffer, writer->size);
    }
}